

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RNEMDParameters.cpp
# Opt level: O0

bool __thiscall OpenMD::RNEMD::RNEMDParameters::requiresElectricField(RNEMDParameters *this)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string token;
  StringTokenizer tokenizer;
  RNEMDParameters *in_stack_fffffffffffffee8;
  undefined6 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef6;
  undefined1 in_stack_fffffffffffffef7;
  StringTokenizer *in_stack_fffffffffffffef8;
  locale *loc;
  int local_e4;
  string *in_stack_ffffffffffffff20;
  string *in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  locale local_a1;
  string local_a0 [32];
  string local_80 [24];
  StringTokenizer *in_stack_ffffffffffffff98;
  
  if (!requiresElectricField::wasParsed) {
    getOutputFields_abi_cxx11_(in_stack_fffffffffffffee8);
    loc = &local_a1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28,
               (allocator<char> *)in_stack_ffffffffffffff20);
    StringTokenizer::StringTokenizer
              ((StringTokenizer *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
               in_stack_ffffffffffffff20);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    std::__cxx11::string::~string(local_80);
    do {
      bVar1 = StringTokenizer::hasMoreTokens(in_stack_fffffffffffffef8);
      if (!bVar1) break;
      StringTokenizer::nextToken_abi_cxx11_(in_stack_ffffffffffffff98);
      in_stack_fffffffffffffef8 = (StringTokenizer *)&stack0xffffffffffffff20;
      std::locale::locale((locale *)in_stack_fffffffffffffef8);
      toUpper<std::__cxx11::string>(in_RDI,loc);
      std::locale::~locale((locale *)&stack0xffffffffffffff20);
      in_stack_fffffffffffffef7 =
           std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffffef7,
                                    CONCAT16(in_stack_fffffffffffffef6,in_stack_fffffffffffffef0)),
                           (char *)in_stack_fffffffffffffee8);
      if (((bool)in_stack_fffffffffffffef7) ||
         (in_stack_fffffffffffffef6 =
               std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT17(in_stack_fffffffffffffef7,
                                        CONCAT16(in_stack_fffffffffffffef6,in_stack_fffffffffffffef0
                                                )),(char *)in_stack_fffffffffffffee8),
         (bool)in_stack_fffffffffffffef6)) {
        *(undefined1 *)&in_RDI[0x3d]._M_string_length = 1;
        local_e4 = 3;
      }
      else {
        local_e4 = 0;
      }
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff28);
    } while (local_e4 == 0);
    requiresElectricField::wasParsed = true;
    StringTokenizer::~StringTokenizer
              ((StringTokenizer *)
               CONCAT17(in_stack_fffffffffffffef7,
                        CONCAT16(in_stack_fffffffffffffef6,in_stack_fffffffffffffef0)));
  }
  return (bool)((byte)in_RDI[0x3d]._M_string_length & 1);
}

Assistant:

bool RNEMDParameters::requiresElectricField() {
    static bool wasParsed {false};

    if (!wasParsed) {
      StringTokenizer tokenizer(getOutputFields(), " ,;|\t\n\r");

      while (tokenizer.hasMoreTokens()) {
        std::string token(tokenizer.nextToken());
        toUpper(token);

        if (token == "ELECTRICFIELD" || token == "ELECTROSTATICPOTENTIAL") {
          calculateElectricField_ = true;
          break;
        }
      }

      wasParsed = true;
    }

    return calculateElectricField_;
  }